

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSim.c
# Opt level: O3

Vec_Ptr_t * Ssw_SmlSimDataPointers(Ssw_Sml_t *p)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  void **ppvVar3;
  int iVar4;
  Vec_Ptr_t *pVVar5;
  void **__s;
  long lVar6;
  long lVar7;
  
  pVVar2 = p->pAig->vObjs;
  iVar1 = pVVar2->nSize;
  lVar7 = (long)iVar1;
  pVVar5 = (Vec_Ptr_t *)malloc(0x10);
  iVar4 = 8;
  if (6 < iVar1 - 1U) {
    iVar4 = iVar1;
  }
  pVVar5->nCap = iVar4;
  if (iVar4 == 0) {
    __s = (void **)0x0;
  }
  else {
    __s = (void **)malloc((long)iVar4 << 3);
  }
  pVVar5->pArray = __s;
  pVVar5->nSize = iVar1;
  memset(__s,0,lVar7 * 8);
  if (0 < iVar1) {
    ppvVar3 = pVVar2->pArray;
    lVar6 = 0;
    do {
      if (ppvVar3[lVar6] != (void *)0x0) {
        if (lVar7 <= lVar6) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                        ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
        }
        __s[lVar6] = (void *)((long)&p[1].pAig + (long)(int)lVar6 * (long)p->nWordsTotal * 4);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < lVar7);
  }
  return pVVar5;
}

Assistant:

Vec_Ptr_t * Ssw_SmlSimDataPointers( Ssw_Sml_t * p )
{
    Vec_Ptr_t * vSimInfo;
    Aig_Obj_t * pObj;
    int i;
    vSimInfo = Vec_PtrStart( Aig_ManObjNumMax(p->pAig) );
    Aig_ManForEachObj( p->pAig, pObj, i )
        Vec_PtrWriteEntry( vSimInfo, i, Ssw_ObjSim(p, i) );
    return vSimInfo;
}